

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TriangleAttributeCase::verifyImage
          (TriangleAttributeCase *this,ConstPixelBufferAccess *testImageAccess,
          ConstPixelBufferAccess *referenceImageAccess)

{
  ostringstream *poVar1;
  TextureFormat log;
  bool bVar2;
  int iVar3;
  RenderTarget *pRVar4;
  PixelBufferAccess *diffMask_00;
  ConstPixelBufferAccess *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  ChannelOrder __fd;
  int in_R8D;
  allocator<char> aStack_4e8;
  allocator<char> local_4e7;
  allocator<char> local_4e6;
  allocator<char> local_4e5;
  allocator<char> local_4e4;
  allocator<char> local_4e3;
  allocator<char> local_4e2;
  allocator<char> local_4e1;
  Surface diffMask;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  LogImageSet local_3c8;
  ConstPixelBufferAccess local_388;
  LogImage local_360;
  LogImage local_2d0;
  LogImage local_240;
  undefined1 local_1b0 [384];
  
  pRVar4 = Context::getRenderTarget
                     ((this->super_TriangleCaseBase).super_RenderTestCase.super_TestCase.m_context);
  log = (TextureFormat)
        ((this->super_TriangleCaseBase).super_RenderTestCase.super_TestCase.super_TestCase.
         super_TestNode.m_testCtx)->m_log;
  if (pRVar4->m_numSamples < 2) {
    tcu::Surface::Surface(&diffMask,200,200);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Comparing images... ");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Deviation within radius of ");
    std::ostream::operator<<(poVar1,1);
    std::operator<<((ostream *)poVar1," is allowed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::ostream::operator<<(poVar1,6);
    std::operator<<((ostream *)poVar1," faulty pixels are allowed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&diffMask);
    diffMask_00 = (PixelBufferAccess *)local_1b0;
    iVar3 = compareColoredImages
                      ((TestLog *)log,testImageAccess,referenceImageAccess,diffMask_00,in_R8D);
    if (6 < iVar3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"Images",&local_4e1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"Image comparison",&local_4e2);
      tcu::LogImageSet::LogImageSet(&local_3c8,&local_3e8,&local_408);
      __fd = log.order;
      tcu::LogImageSet::write(&local_3c8,__fd,__buf,(size_t)diffMask_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"TestImage",&local_4e3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_448,"Test image",&local_4e4);
      tcu::LogImage::LogImage
                (&local_240,&local_428,&local_448,testImageAccess,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_240,__fd,__buf_00,(size_t)testImageAccess);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_468,"ReferenceImage",&local_4e5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"Reference image",&local_4e6);
      tcu::LogImage::LogImage
                (&local_2d0,&local_468,&local_488,referenceImageAccess,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2d0,__fd,__buf_01,(size_t)referenceImageAccess);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"DifferenceMask",&local_4e7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c8,"Difference mask",&aStack_4e8);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_388,&diffMask);
      access = &local_388;
      tcu::LogImage::LogImage
                (&local_360,&local_4a8,&local_4c8,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_360,__fd,__buf_02,(size_t)access);
      tcu::TestLog::endImageSet((TestLog *)log);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Got ");
      std::ostream::operator<<(poVar1,iVar3);
      std::operator<<((ostream *)poVar1," faulty pixel(s).");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      tcu::LogImage::~LogImage(&local_360);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4a8);
      tcu::LogImage::~LogImage(&local_2d0);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_468);
      tcu::LogImage::~LogImage(&local_240);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_428);
      tcu::LogImageSet::~LogImageSet(&local_3c8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_3e8);
      tcu::TestContext::setTestResult
                ((this->super_TriangleCaseBase).super_RenderTestCase.super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Got faulty pixels");
    }
    tcu::Surface::~Surface(&diffMask);
  }
  else {
    bVar2 = tcu::fuzzyCompare((TestLog *)log,"Images",glcts::fixed_sample_locations_values + 1,
                              referenceImageAccess,testImageAccess,0.3,COMPARE_LOG_ON_ERROR);
    if (!bVar2) {
      tcu::TestContext::setTestResult
                ((this->super_TriangleCaseBase).super_RenderTestCase.super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Got faulty pixels");
      return;
    }
  }
  return;
}

Assistant:

void TriangleAttributeCase::verifyImage (const tcu::ConstPixelBufferAccess& testImageAccess, const tcu::ConstPixelBufferAccess& referenceImageAccess)
{
	const bool		msaa	= m_context.getRenderTarget().getNumSamples() > 1;
	tcu::TestLog&	log		= m_testCtx.getLog();

	if (!msaa)
	{
		const int		kernelRadius	= 1;
		const int		faultyLimit		= 6;
		int				faultyPixels;
		tcu::Surface	diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;
		log << TestLog::Message << faultyLimit << " faulty pixels are allowed." << TestLog::EndMessage;
		faultyPixels = compareColoredImages(log, testImageAccess, referenceImageAccess, diffMask.getAccess(), kernelRadius);

		if (faultyPixels > faultyLimit)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testImageAccess)
				<< TestLog::Image("ReferenceImage", "Reference image", referenceImageAccess)
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
	else
	{
		const float threshold = 0.3f;
		if (!tcu::fuzzyCompare(log, "Images", "", referenceImageAccess, testImageAccess, threshold, tcu::COMPARE_LOG_ON_ERROR))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
	}
}